

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImgDisplay::_resize<unsigned_int>
          (CImgDisplay *this,uint pixel_type,uint ndimx,uint ndimy,bool force_redraw)

{
  Display *pDVar1;
  X11_info *pXVar2;
  void *__s;
  undefined8 uVar3;
  uint in_ECX;
  uint in_EDX;
  long in_RDI;
  byte in_R8B;
  uint *unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint *in_stack_00000010;
  uint *ndata;
  Display *dpy;
  uint local_c;
  long lVar4;
  
  lVar4 = in_RDI;
  pXVar2 = cimg::X11_attr();
  pDVar1 = pXVar2->display;
  cimg::unused<unsigned_int>(&local_c);
  __s = malloc((ulong)(in_EDX * in_ECX) << 2);
  if ((in_R8B & 1) == 0) {
    memset(__s,0,(ulong)in_EDX * 4 * (ulong)in_ECX);
  }
  else {
    _render_resize<unsigned_int,unsigned_int>
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
               (uint)((ulong)lVar4 >> 0x20),(uint)lVar4);
  }
  *(void **)(in_RDI + 0x4f0) = __s;
  (**(code **)(*(long *)(in_RDI + 0x4e8) + 0x60))(*(undefined8 *)(in_RDI + 0x4e8));
  uVar3 = *(undefined8 *)(*(long *)(pDVar1 + 0xe8) + (long)*(int *)(pDVar1 + 0xe0) * 0x80 + 0x40);
  pXVar2 = cimg::X11_attr();
  uVar3 = XCreateImage(pDVar1,uVar3,pXVar2->nb_bits,2,0,*(undefined8 *)(in_RDI + 0x4f0),in_EDX,
                       in_ECX,8,0);
  *(undefined8 *)(in_RDI + 0x4e8) = uVar3;
  return;
}

Assistant:

void _resize(T pixel_type, const unsigned int ndimx, const unsigned int ndimy, const bool force_redraw) {
      Display *const dpy = cimg::X11_attr().display;
      cimg::unused(pixel_type);

#ifdef cimg_use_xshm
      if (_shminfo) {
        XShmSegmentInfo *const nshminfo = new XShmSegmentInfo;
        XImage *const nimage = XShmCreateImage(dpy,DefaultVisual(dpy,DefaultScreen(dpy)),
                                               cimg::X11_attr().nb_bits,ZPixmap,0,nshminfo,ndimx,ndimy);
        if (!nimage) { delete nshminfo; return; }
        else {
          nshminfo->shmid = shmget(IPC_PRIVATE,ndimx*ndimy*sizeof(T),IPC_CREAT | 0777);
          if (nshminfo->shmid==-1) { XDestroyImage(nimage); delete nshminfo; return; }
          else {
            nshminfo->shmaddr = nimage->data = (char*)shmat(nshminfo->shmid,0,0);
            if (nshminfo->shmaddr==(char*)-1) { shmctl(nshminfo->shmid,IPC_RMID,0); XDestroyImage(nimage); delete nshminfo; return; }
            else {
              nshminfo->readOnly = False;
              cimg::X11_attr().is_shm_enabled = true;
              XErrorHandler oldXErrorHandler = XSetErrorHandler(_assign_xshm);
              XShmAttach(dpy,nshminfo);
              XFlush(dpy);
              XSetErrorHandler(oldXErrorHandler);
              if (!cimg::X11_attr().is_shm_enabled) {
                shmdt(nshminfo->shmaddr);
                shmctl(nshminfo->shmid,IPC_RMID,0);
                XDestroyImage(nimage);
                delete nshminfo;
                return;
              } else {
                T *const ndata = (T*)nimage->data;
                if (force_redraw) _render_resize((T*)_data,_width,_height,ndata,ndimx,ndimy);
                else std::memset(ndata,0,sizeof(T)*ndimx*ndimy);
                XShmDetach(dpy,_shminfo);
                XDestroyImage(_image);
                shmdt(_shminfo->shmaddr);
                shmctl(_shminfo->shmid,IPC_RMID,0);
                delete _shminfo;
                _shminfo = nshminfo;
                _image = nimage;
                _data = (void*)ndata;
              }
            }
          }
        }
      } else
#endif
        {
          T *ndata = (T*)std::malloc(ndimx*ndimy*sizeof(T));
          if (force_redraw) _render_resize((T*)_data,_width,_height,ndata,ndimx,ndimy);
          else std::memset(ndata,0,sizeof(T)*ndimx*ndimy);
          _data = (void*)ndata;
          XDestroyImage(_image);
          _image = XCreateImage(dpy,DefaultVisual(dpy,DefaultScreen(dpy)),
                                cimg::X11_attr().nb_bits,ZPixmap,0,(char*)_data,ndimx,ndimy,8,0);
        }
    }